

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_sysconfig_files.c
# Opt level: O1

ares_status_t
parse_nsswitch_line(ares_channel_t *channel,ares_sysconfig_t *sysconfig,ares_buf_t *line)

{
  ares_bool_t aVar1;
  ares_status_t aVar2;
  ares_status_t aVar3;
  size_t sVar4;
  undefined8 *puVar5;
  ares_array_t *sects;
  char option [32];
  ares_array_t *local_40;
  char local_38 [40];
  
  local_40 = (ares_array_t *)0x0;
  aVar1 = ares_buf_begins_with(line,"#",1);
  aVar2 = ARES_SUCCESS;
  if (aVar1 == ARES_FALSE) {
    aVar3 = ares_buf_split(line,(uchar *)":",1,ARES_BUF_SPLIT_TRIM,2,&local_40);
    if (aVar3 == ARES_SUCCESS) {
      sVar4 = ares_array_len(local_40);
      aVar3 = ARES_SUCCESS;
      if (sVar4 == 2) {
        puVar5 = (undefined8 *)ares_array_at(local_40,0);
        aVar3 = buf_fetch_string((ares_buf_t *)*puVar5,local_38,0x20);
        if ((aVar3 == ARES_SUCCESS) &&
           (aVar1 = ares_streq(local_38,"hosts"), aVar3 = ARES_SUCCESS, aVar1 != ARES_FALSE)) {
          puVar5 = (undefined8 *)ares_array_at(local_40,1);
          aVar3 = config_lookup(sysconfig,(ares_buf_t *)*puVar5," \t");
        }
      }
    }
    ares_array_destroy(local_40);
    aVar2 = ARES_SUCCESS;
    if (aVar3 == ARES_ENOMEM) {
      aVar2 = ARES_ENOMEM;
    }
  }
  return aVar2;
}

Assistant:

static ares_status_t parse_nsswitch_line(const ares_channel_t *channel,
                                         ares_sysconfig_t     *sysconfig,
                                         ares_buf_t           *line)
{
  char          option[32];
  ares_status_t status = ARES_SUCCESS;
  ares_array_t *sects  = NULL;
  ares_buf_t  **bufptr;
  ares_buf_t   *buf;

  (void)channel;

  /* Ignore lines beginning with a comment */
  if (ares_buf_begins_with(line, (const unsigned char *)"#", 1)) {
    return ARES_SUCCESS;
  }

  /* database : values (space delimited) */
  status = ares_buf_split(line, (const unsigned char *)":", 1,
                          ARES_BUF_SPLIT_TRIM, 2, &sects);

  if (status != ARES_SUCCESS || ares_array_len(sects) != 2) {
    goto done;
  }

  bufptr = ares_array_at(sects, 0);
  buf    = *bufptr;

  status = buf_fetch_string(buf, option, sizeof(option));
  if (status != ARES_SUCCESS) {
    goto done;
  }

  /* Only support "hosts:" */
  if (!ares_streq(option, "hosts")) {
    goto done;
  }

  /* Values are space separated */
  bufptr = ares_array_at(sects, 1);
  buf    = *bufptr;
  status = config_lookup(sysconfig, buf, " \t");

done:
  ares_array_destroy(sects);
  if (status != ARES_ENOMEM) {
    status = ARES_SUCCESS;
  }
  return status;
}